

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O2

double nifti_stat2hzscore(double val,int code,double p1,double p2,double p3)

{
  pqpair pVar2;
  pqpair pq;
  double dVar1;
  
  pVar2 = stat2pq(val,code,p1,p2,p3);
  pq.q = (1.0 - pVar2.p) * 0.5;
  pq.p = (pVar2.p + 1.0) * 0.5;
  dVar1 = normal_pq2s(pq);
  return dVar1;
}

Assistant:

double nifti_stat2hzscore( double val, int code, double p1,double p2,double p3 )
{
   pqpair pq ;

   pq = stat2pq( val, code, p1,p2,p3 ) ;                    /* find cdf */
   pq.q = 0.5*(1.0-pq.p) ; pq.p = 0.5*(1.0+pq.p) ;          /* mangle it */
   return normal_pq2s( pq ) ;                               /* find z  */
}